

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O2

void testing::internal::PrintBytesInObjectTo(uchar *obj_bytes,size_t count,ostream *os)

{
  ostream *poVar1;
  size_t start;
  
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::operator<<(poVar1,"-byte object <");
  if (count < 0x84) {
    start = 0;
  }
  else {
    anon_unknown_1::PrintByteSegmentInObjectTo(obj_bytes,0,0x40,os);
    std::operator<<(os," ... ");
    start = count - 0x3f & 0xfffffffffffffffe;
    count = count - start;
  }
  anon_unknown_1::PrintByteSegmentInObjectTo(obj_bytes,start,count,os);
  std::operator<<(os,">");
  return;
}

Assistant:

void PrintBytesInObjectTo(const unsigned char* obj_bytes, size_t count,
                          ostream* os) {
  PrintBytesInObjectToImpl(obj_bytes, count, os);
}